

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

int has_ext(char *ext)

{
  byte *__haystack;
  char **ppcVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  byte *pbVar8;
  ulong uVar9;
  bool bVar10;
  
  ppcVar1 = exts_i;
  pbVar8 = (byte *)exts;
  if (max_loaded_major < 3) {
    uVar7 = 0;
    if ((ext != (char *)0x0 && exts != (char *)0x0) &&
       (pbVar4 = (byte *)strstr(exts,ext), uVar7 = 0, pbVar4 != (byte *)0x0)) {
      sVar5 = strlen(ext);
      do {
        __haystack = pbVar4 + sVar5;
        if (((pbVar4 == pbVar8) || (pbVar4[-1] == 0x20)) && ((*__haystack & 0xdf) == 0)) {
          return 1;
        }
        pbVar4 = (byte *)strstr((char *)__haystack,ext);
        pbVar8 = __haystack;
      } while (pbVar4 != (byte *)0x0);
    }
  }
  else {
    uVar9 = (ulong)num_exts_i;
    bVar10 = 0 < (long)uVar9;
    if ((0 < (long)uVar9) && (iVar3 = strcmp(*exts_i,ext), iVar3 != 0)) {
      uVar2 = 1;
      do {
        uVar6 = uVar2;
        if (uVar9 == uVar6) break;
        iVar3 = strcmp(ppcVar1[uVar6],ext);
        uVar2 = uVar6 + 1;
      } while (iVar3 != 0);
      bVar10 = uVar6 < uVar9;
    }
    uVar7 = (uint)bVar10;
  }
  return uVar7;
}

Assistant:

static int has_ext(const char *ext) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(max_loaded_major < 3) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;

        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];

            if(strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}